

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O2

shared_ptr<chrono::ChLoadable> __thiscall chrono::ChLoaderU::GetLoadable(ChLoaderU *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<chrono::ChLoadable> sVar1;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLoadableU,void>
            ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x18));
  sVar1.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLoadable>)
         sVar1.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChLoadable> GetLoadable() override { return loadable; }